

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
Parser::Parser(Parser *this,ofstream *out_file,Tokenizer *tokenizer,VM_Writer *vm_writer)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  __l;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_150;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_102;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_101;
  int local_100 [7];
  int local_e4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_60;
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  VM_Writer *vm_writer_local;
  Tokenizer *tokenizer_local;
  ofstream *out_file_local;
  Parser *this_local;
  
  this->out_file = out_file;
  this->tokenizer = tokenizer;
  local_28 = (undefined1  [8])vm_writer;
  vm_writer_local = (VM_Writer *)tokenizer;
  tokenizer_local = (Tokenizer *)out_file;
  out_file_local = (ofstream *)this;
  std::__cxx11::string::string((string *)&this->cur_token);
  std::__cxx11::string::string((string *)&this->prev_token);
  std::__cxx11::string::string((string *)&this->class_name);
  Symbol_Table::Symbol_Table(&this->symbol_table);
  this->vm_writer = (VM_Writer *)local_28;
  std::__cxx11::string::string((string *)&this->cur_subroutine_type);
  local_e0 = &local_d8;
  local_e4 = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_e0,(char (*) [5])"true",&local_e4);
  local_e0 = &local_b0;
  local_100[2] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[6],_int,_true>(local_e0,(char (*) [6])"false",local_100 + 2);
  local_e0 = &local_88;
  local_100[1] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_e0,(char (*) [5])"null",local_100 + 1);
  local_e0 = &local_60;
  local_100[0] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[5],_int,_true>(local_e0,(char (*) [5])"this",local_100);
  local_38 = &local_d8;
  local_30 = 4;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::allocator(&local_102);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->keyword_constant_map,__l,&local_101,&local_102);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~allocator(&local_102);
  local_150 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)&local_38;
  do {
    local_150 = local_150 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(local_150);
  } while (local_150 != &local_d8);
  query_tokenizer(this);
  parse_class(this);
  return;
}

Assistant:

Parser(std::ofstream& out_file, Tokenizer& tokenizer, VM_Writer& vm_writer): out_file(out_file),
            tokenizer(tokenizer), vm_writer(vm_writer)
    {
        query_tokenizer();
        parse_class();
    }